

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dictionary.h
# Opt level: O0

int __thiscall
JsUtil::
WeaklyReferencedKeyDictionary<const_Js::PropertyRecord,_ThreadContext::PropertyGuardEntry_*,_Js::PropertyRecordPointerComparer,_true>
::FindEntry<Js::PropertyRecord>
          (WeaklyReferencedKeyDictionary<const_Js::PropertyRecord,_ThreadContext::PropertyGuardEntry_*,_Js::PropertyRecordPointerComparer,_true>
           *this,PropertyRecord *key,hash_t hash,uint *bucket,int *previous)

{
  bool bVar1;
  BOOL BVar2;
  int **ppiVar3;
  WeakRefDictionaryEntry<const_Js::PropertyRecord,_Memory::WriteBarrierPtr<ThreadContext::PropertyGuardEntry>_>
  **ppWVar4;
  RecyclerWeakReference<const_Js::PropertyRecord> *pRVar5;
  PropertyRecord *local_48;
  PropertyRecord *strongRef;
  int i;
  BOOL inSweep;
  int *previous_local;
  uint *bucket_local;
  hash_t hash_local;
  PropertyRecord *key_local;
  WeaklyReferencedKeyDictionary<const_Js::PropertyRecord,_ThreadContext::PropertyGuardEntry_*,_Js::PropertyRecordPointerComparer,_true>
  *this_local;
  
  ppiVar3 = Memory::WriteBarrierPtr::operator_cast_to_int__((WriteBarrierPtr *)&this->buckets);
  if (*ppiVar3 != (int *)0x0) {
    BVar2 = Memory::Recycler::IsSweeping(this->recycler);
    *previous = -1;
    ppiVar3 = Memory::WriteBarrierPtr::operator_cast_to_int__((WriteBarrierPtr *)&this->buckets);
    strongRef._0_4_ = (*ppiVar3)[*bucket];
    while (-1 < (int)strongRef) {
      ppWVar4 = Memory::WriteBarrierPtr::operator_cast_to_WeakRefDictionaryEntry__
                          ((WriteBarrierPtr *)&this->entries);
      if ((*ppWVar4)[(int)strongRef].hash == hash) {
        if (BVar2 == 0) {
          ppWVar4 = Memory::WriteBarrierPtr::operator_cast_to_WeakRefDictionaryEntry__
                              ((WriteBarrierPtr *)&this->entries);
          pRVar5 = Memory::
                   WriteBarrierPtr<const_Memory::RecyclerWeakReference<const_Js::PropertyRecord>_>::
                   operator->(&(*ppWVar4)[(int)strongRef].key);
          local_48 = Memory::RecyclerWeakReference<const_Js::PropertyRecord>::FastGet(pRVar5);
        }
        else {
          ppWVar4 = Memory::WriteBarrierPtr::operator_cast_to_WeakRefDictionaryEntry__
                              ((WriteBarrierPtr *)&this->entries);
          pRVar5 = Memory::
                   WriteBarrierPtr<const_Memory::RecyclerWeakReference<const_Js::PropertyRecord>_>::
                   operator->(&(*ppWVar4)[(int)strongRef].key);
          local_48 = Memory::RecyclerWeakReference<const_Js::PropertyRecord>::Get(pRVar5);
        }
        if (local_48 != (PropertyRecord *)0x0) {
          bVar1 = Js::PropertyRecordPointerComparer::Equals(local_48,key);
          if (bVar1) {
            return (int)strongRef;
          }
          goto LAB_00ace752;
        }
        strongRef._0_4_ = RemoveEntry(this,(int)strongRef,*previous,*bucket);
      }
      else {
LAB_00ace752:
        *previous = (int)strongRef;
        ppWVar4 = Memory::WriteBarrierPtr::operator_cast_to_WeakRefDictionaryEntry__
                            ((WriteBarrierPtr *)&this->entries);
        strongRef._0_4_ = (*ppWVar4)[(int)strongRef].next;
      }
    }
  }
  return -1;
}

Assistant:

inline int FindEntry(const TLookup* key, hash_t const hash, uint& bucket, int& previous)
        {
            if (buckets != nullptr)
            {
                BOOL inSweep = this->recycler->IsSweeping();
                previous = -1;
                for (int i = buckets[bucket]; i >= 0; )
                {
                    if (entries[i].hash == hash)
                    {
                        TKey* strongRef = nullptr;

                        if (!inSweep)
                        {
                            // Quickly check for null if we're not in sweep- if it's null, it's definitely been collected
                            // so remove
                            strongRef = entries[i].key->FastGet();
                        }
                        else
                        {
                            // If we're in sweep, use the slower Get which checks if the object is getting collected
                            // This could return null too but we won't clean it up now, we'll clean it up later
                            strongRef = entries[i].key->Get();
                        }

                        if (strongRef == nullptr)
                        {
                            i = RemoveEntry(i, previous, bucket);
                            continue;
                        }
                        else
                        {
                            // if we get here, strongRef is not null
                            if (KeyComparer::Equals(strongRef, key))
                                return i;
                        }
                    }

                    previous = i;
                    i = entries[i].next;
                }
            }
            return -1;
        }